

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableAllTest_InsertValue_Test
          (HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  
  HashtableAllTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::HashtableAllTest(in_RDI);
  (in_RDI->
  super_HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__HashtableAllTest_InsertValue_Test_01314bc8;
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, InsertValue) {
  // First, try some straightforward insertions.
  EXPECT_TRUE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1111)));

  // Check the return type.
  pair<typename TypeParam::iterator, bool> insert_it;
  insert_it = this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(false, insert_it.second);  // false: already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(1));

  insert_it = this->ht_.insert(this->UniqueObject(2));
  EXPECT_EQ(true, insert_it.second);  // true: not already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(2));
}